

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::initial_kmer_lcp(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                   *this,uint k,uint bits_per_char,
                  vector<unsigned_long,_std::allocator<unsigned_long>_> *param_3)

{
  value_type vVar1;
  unsigned_long uVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  const_reference pvVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  uint local_54;
  ulong uStack_50;
  uint lcp_1;
  size_t i;
  unsigned_long uStack_40;
  uint lcp;
  pair<unsigned_long,_unsigned_long> left_B;
  pair<unsigned_long,_unsigned_long> right_B;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_B2_local;
  uint bits_per_char_local;
  uint k_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::assign
            (&this->local_LCP,this->local_size,&this->n);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->local_B);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(param_3);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
            ((pair<unsigned_long,_unsigned_long> *)&left_B.second,pvVar5,pvVar6);
  pVar7 = mxx::right_shift<std::pair<unsigned_long,unsigned_long>>
                    ((pair<unsigned_long,_unsigned_long> *)&left_B.second,&this->comm);
  iVar3 = mxx::comm::rank(&this->comm);
  if (iVar3 == 0) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_LCP,0);
    *pvVar5 = 0;
  }
  else {
    uStack_40 = pVar7.first;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,0);
    left_B.first = pVar7.second;
    if ((uStack_40 != *pvVar5) ||
       ((pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->local_B,0), uStack_40 == *pvVar5 &&
        (pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_3,0),
        left_B.first != *pvVar6)))) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,0);
      i._4_4_ = lcp_bitwise<unsigned_long>(uStack_40,*pvVar5,k,bits_per_char);
      if (i._4_4_ == k) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](param_3,0);
        uVar4 = lcp_bitwise<unsigned_long>(left_B.first,*pvVar6,k,bits_per_char);
        i._4_4_ = uVar4 + i._4_4_;
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_LCP,0);
      *pvVar5 = (ulong)i._4_4_;
    }
  }
  uStack_50 = 1;
  do {
    if (this->local_size <= uStack_50) {
      return;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,uStack_50 - 1);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,uStack_50);
    if (vVar1 == *pvVar5) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,uStack_50 - 1);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,uStack_50);
      if (vVar1 == *pvVar5) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_3,uStack_50 - 1);
        vVar1 = *pvVar6;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_3,uStack_50);
        if (vVar1 != *pvVar6) goto LAB_00225c56;
      }
    }
    else {
LAB_00225c56:
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,uStack_50 - 1);
      uVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,uStack_50);
      local_54 = lcp_bitwise<unsigned_long>(uVar2,*pvVar5,k,bits_per_char);
      if (local_54 == k) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_3,uStack_50 - 1);
        uVar2 = *pvVar6;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (param_3,uStack_50);
        uVar4 = lcp_bitwise<unsigned_long>(uVar2,*pvVar6,k,bits_per_char);
        local_54 = uVar4 + local_54;
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_LCP,uStack_50);
      *pvVar5 = (ulong)local_54;
    }
    uStack_50 = uStack_50 + 1;
  } while( true );
}

Assistant:

void initial_kmer_lcp(unsigned int k, unsigned int bits_per_char,
                      const std::vector<index_t>& local_B2) {
    // for each bucket boundary (using both the B1 and the B2 buckets):
    //    get the LCP by getting position of first different bit and dividing by
    //    `bits_per_char`

    // resize to size `local_size` and set all items to max of n
    local_LCP.assign(local_size, n);

    // find bucket boundaries (including across processors)

    // 1) getting next element to left
    std::pair<index_t, index_t> right_B(local_B.back(), local_B2.back());
    std::pair<index_t, index_t> left_B = mxx::right_shift(right_B, comm);

    // initialize first LCP
    if (comm.rank() == 0) {
        local_LCP[0] = 0;
    } else {
        if (left_B.first != local_B[0]
            || (left_B.first == local_B[0] && left_B.second != local_B2[0])) {
            unsigned int lcp = lcp_bitwise(left_B.first, local_B[0], k, bits_per_char);
            if (lcp == k)
                lcp += lcp_bitwise(left_B.second, local_B2[0], k, bits_per_char);
            local_LCP[0] = lcp;
        }
    }

    // intialize the LCP for all other elements for bucket boundaries
    for (std::size_t i = 1; i < local_size; ++i)
    {
        if (local_B[i-1] != local_B[i]
            || (local_B[i-1] == local_B[i] && local_B2[i-1] != local_B2[i])) {
            unsigned int lcp = lcp_bitwise(local_B[i-1], local_B[i], k, bits_per_char);
            if (lcp == k)
                lcp += lcp_bitwise(local_B2[i-1], local_B2[i], k, bits_per_char);
            local_LCP[i] = lcp;
        }
    }
}